

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2min_distance_targets.cc
# Opt level: O2

bool __thiscall
S2MinDistanceShapeIndexTarget::UpdateMinDistance
          (S2MinDistanceShapeIndexTarget *this,S2Cell *cell,S2MinDistance *min_dist)

{
  bool bVar1;
  S2MinDistanceTarget local_40;
  undefined **local_38;
  undefined8 local_30;
  undefined8 uStack_28;
  VType local_20;
  VType VStack_18;
  VType local_10;
  VType VStack_8;
  
  local_38 = &PTR__S2Region_003047c0;
  local_30 = *(undefined8 *)&cell->face_;
  uStack_28 = *(undefined8 *)((long)&(cell->id_).id_ + 5);
  local_20 = (cell->uv_).bounds_[0].bounds_.c_[0];
  VStack_18 = (cell->uv_).bounds_[0].bounds_.c_[1];
  local_10 = (cell->uv_).bounds_[1].bounds_.c_[0];
  VStack_8 = (cell->uv_).bounds_[1].bounds_.c_[1];
  local_40._vptr_S2DistanceTarget = (_func_int **)&PTR__S2MinDistanceCellTarget_00304bc0;
  bVar1 = UpdateMinDistance(this,&local_40,min_dist);
  return bVar1;
}

Assistant:

bool S2MinDistanceShapeIndexTarget::UpdateMinDistance(
    const S2Cell& cell, S2MinDistance* min_dist) {
  S2ClosestEdgeQuery::CellTarget target(cell);
  return UpdateMinDistance(&target, min_dist);
}